

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

void __thiscall TTD::EventLog::RecordEmitLogEvent(EventLog *this,JavascriptString *uriString)

{
  charcount_t cVar1;
  uint32 uVar2;
  HeapAllocator *alloc;
  utf8char_t *dest;
  char16 *source;
  size_t emitUriLength;
  ulong byteSize;
  undefined1 local_68 [8];
  TrackAllocData data;
  AutoArrayPtr<char> uri;
  
  RecordGetInitializedEvent_DataOnly<TTD::NSLogEvents::ExplicitLogWriteEventLogEntry,(TTD::NSLogEvents::EventKind)13>
            (this);
  cVar1 = Js::JavascriptString::GetLength(uriString);
  uVar2 = UInt32Math::Mul<3u>(cVar1);
  byteSize = (ulong)uVar2;
  local_68 = (undefined1  [8])&char::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_3f03208;
  data.filename._0_4_ = 0x364;
  data.plusSize = byteSize;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_68);
  dest = (utf8char_t *)new__<Memory::HeapAllocator>(byteSize,alloc,0x3818c8);
  data._32_8_ = dest;
  source = Js::JavascriptString::GetString(uriString);
  cVar1 = Js::JavascriptString::GetLength(uriString);
  emitUriLength = utf8::EncodeInto<(utf8::Utf8EncodingKind)0>(dest,byteSize,source,cVar1);
  EmitLog(this,(char *)data._32_8_,emitUriLength,(EventLogEntry *)0x0);
  AutoArrayPtr<char>::~AutoArrayPtr((AutoArrayPtr<char> *)&data.line);
  return;
}

Assistant:

void EventLog::RecordEmitLogEvent(Js::JavascriptString* uriString)
    {
        this->RecordGetInitializedEvent_DataOnly<NSLogEvents::ExplicitLogWriteEventLogEntry, NSLogEvents::EventKind::ExplicitLogWriteTag>();

        size_t cbUri = UInt32Math::Mul<3>(uriString->GetLength());
        AutoArrayPtr<char> uri(HeapNewArrayZ(char, cbUri), cbUri);
        size_t uriLength = utf8::EncodeInto<utf8::Utf8EncodingKind::Cesu8>((LPUTF8)((char*)uri), cbUri, uriString->GetString(), uriString->GetLength());

        this->EmitLog(uri, uriLength);
    }